

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

_Bool use_http_1_1plus(Curl_easy *data,connectdata *conn)

{
  long lVar1;
  
  if ((((data->state).httpversion != 10) && (conn->httpversion != 10)) &&
     (lVar1 = (data->set).httpversion, 10 < conn->httpversion || lVar1 != 1)) {
    return 1 < lVar1 || lVar1 == 0;
  }
  return false;
}

Assistant:

static bool use_http_1_1plus(const struct Curl_easy *data,
                             const struct connectdata *conn)
{
  if((data->state.httpversion == 10) || (conn->httpversion == 10))
    return FALSE;
  if((data->set.httpversion == CURL_HTTP_VERSION_1_0) &&
     (conn->httpversion <= 10))
    return FALSE;
  return ((data->set.httpversion == CURL_HTTP_VERSION_NONE) ||
          (data->set.httpversion >= CURL_HTTP_VERSION_1_1));
}